

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localizer.cpp
# Opt level: O0

CameraPosition * ary::matrixToPosition(CameraPosition *__return_storage_ptr__,Matx44f *matrix)

{
  float fVar1;
  float *pfVar2;
  _OutputArray *p_Var3;
  _OutputArray local_b0;
  _InputArray local_98;
  undefined1 local_70 [8];
  Mat rotation;
  Matx44f *matrix_local;
  
  rotation.step.buf[1] = (size_t)matrix;
  CameraPosition::CameraPosition(__return_storage_ptr__);
  cv::Mat::Mat((Mat *)local_70,3,3,5);
  pfVar2 = cv::Matx<float,_4,_4>::operator()((Matx<float,_4,_4> *)rotation.step.buf[1],0,0);
  fVar1 = *pfVar2;
  pfVar2 = cv::Mat::at<float>((Mat *)local_70,0,0);
  *pfVar2 = fVar1;
  pfVar2 = cv::Matx<float,_4,_4>::operator()((Matx<float,_4,_4> *)rotation.step.buf[1],0,1);
  fVar1 = *pfVar2;
  pfVar2 = cv::Mat::at<float>((Mat *)local_70,0,1);
  *pfVar2 = fVar1;
  pfVar2 = cv::Matx<float,_4,_4>::operator()((Matx<float,_4,_4> *)rotation.step.buf[1],0,2);
  fVar1 = *pfVar2;
  pfVar2 = cv::Mat::at<float>((Mat *)local_70,0,2);
  *pfVar2 = fVar1;
  pfVar2 = cv::Matx<float,_4,_4>::operator()((Matx<float,_4,_4> *)rotation.step.buf[1],1,0);
  fVar1 = *pfVar2;
  pfVar2 = cv::Mat::at<float>((Mat *)local_70,1,0);
  *pfVar2 = fVar1;
  pfVar2 = cv::Matx<float,_4,_4>::operator()((Matx<float,_4,_4> *)rotation.step.buf[1],1,1);
  fVar1 = *pfVar2;
  pfVar2 = cv::Mat::at<float>((Mat *)local_70,1,1);
  *pfVar2 = fVar1;
  pfVar2 = cv::Matx<float,_4,_4>::operator()((Matx<float,_4,_4> *)rotation.step.buf[1],1,2);
  fVar1 = *pfVar2;
  pfVar2 = cv::Mat::at<float>((Mat *)local_70,1,2);
  *pfVar2 = fVar1;
  pfVar2 = cv::Matx<float,_4,_4>::operator()((Matx<float,_4,_4> *)rotation.step.buf[1],2,0);
  fVar1 = *pfVar2;
  pfVar2 = cv::Mat::at<float>((Mat *)local_70,2,0);
  *pfVar2 = fVar1;
  pfVar2 = cv::Matx<float,_4,_4>::operator()((Matx<float,_4,_4> *)rotation.step.buf[1],2,1);
  fVar1 = *pfVar2;
  pfVar2 = cv::Mat::at<float>((Mat *)local_70,2,1);
  *pfVar2 = fVar1;
  pfVar2 = cv::Matx<float,_4,_4>::operator()((Matx<float,_4,_4> *)rotation.step.buf[1],2,2);
  fVar1 = *pfVar2;
  pfVar2 = cv::Mat::at<float>((Mat *)local_70,2,2);
  *pfVar2 = fVar1;
  pfVar2 = cv::Matx<float,_4,_4>::operator()((Matx<float,_4,_4> *)rotation.step.buf[1],0,3);
  fVar1 = *pfVar2;
  pfVar2 = cv::Matx<float,_3,_1>::operator()(&__return_storage_ptr__->translation,0);
  *pfVar2 = fVar1;
  pfVar2 = cv::Matx<float,_4,_4>::operator()((Matx<float,_4,_4> *)rotation.step.buf[1],1,3);
  fVar1 = *pfVar2;
  pfVar2 = cv::Matx<float,_3,_1>::operator()(&__return_storage_ptr__->translation,1);
  *pfVar2 = fVar1;
  pfVar2 = cv::Matx<float,_4,_4>::operator()((Matx<float,_4,_4> *)rotation.step.buf[1],2,3);
  fVar1 = *pfVar2;
  pfVar2 = cv::Matx<float,_3,_1>::operator()(&__return_storage_ptr__->translation,2);
  *pfVar2 = fVar1;
  cv::_InputArray::_InputArray(&local_98,(Mat *)local_70);
  cv::_OutputArray::_OutputArray<float,3,1>(&local_b0,&__return_storage_ptr__->rotation);
  p_Var3 = (_OutputArray *)cv::noArray();
  cv::Rodrigues(&local_98,&local_b0,p_Var3);
  cv::_OutputArray::~_OutputArray(&local_b0);
  cv::_InputArray::~_InputArray(&local_98);
  cv::Mat::~Mat((Mat *)local_70);
  return __return_storage_ptr__;
}

Assistant:

CameraPosition matrixToPosition(const Matx44f& matrix) {

    CameraPosition position;

    Mat rotation(3, 3, CV_32FC1);

    rotation.at<float>(0, 0) = matrix(0, 0);
    rotation.at<float>(0, 1) = matrix(0, 1);
    rotation.at<float>(0, 2) = matrix(0, 2);

    rotation.at<float>(1, 0) = matrix(1, 0);
    rotation.at<float>(1, 1) = matrix(1, 1);
    rotation.at<float>(1, 2) = matrix(1, 2);

    rotation.at<float>(2, 0) = matrix(2, 0);
    rotation.at<float>(2, 1) = matrix(2, 1);
    rotation.at<float>(2, 2) = matrix(2, 2);

    position.translation(0) = matrix(0, 3);
    position.translation(1) = matrix(1, 3);
    position.translation(2) = matrix(2, 3);

    cv::Rodrigues(rotation, position.rotation);

    return position;
}